

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::visitSelection
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermSelection *node)

{
  Builder *pBVar1;
  Instruction *pIVar2;
  bool bVar3;
  int iVar4;
  Id IVar5;
  int iVar6;
  Id IVar7;
  Id rValue;
  Decoration DVar8;
  uint uVar9;
  Id IVar10;
  Id op3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *pTVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TIntermTyped *node_00;
  undefined4 extraout_var_07;
  anon_class_1_0_00000001 *paVar13;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar14;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  pointer ppIVar15;
  ulong uVar16;
  bool forwardReferenceOnly;
  bool forwardReferenceOnly_00;
  char *filename;
  undefined4 in_register_00000034;
  TIntermSelection *node_local;
  bool local_81;
  Id local_80;
  Id local_7c;
  anon_class_16_2_3f94c575 isOpSelectable;
  If local_68;
  
  isOpSelectable.node = &node_local;
  node_local = node;
  isOpSelectable.this = this;
  iVar4 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])
                    (node,CONCAT44(in_register_00000034,param_1));
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar4),this);
  iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
  pTVar11 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0xf0))
                               ((long *)CONCAT44(extraout_var_00,iVar4));
  IVar5 = accessChainLoad(this,pTVar11);
  iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
  if ((CONCAT44(extraout_var_01,iVar4) != 0) &&
     (iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(),
     CONCAT44(extraout_var_02,iVar4) != 0)) {
    if (node_local->shortCircuit != true) {
LAB_003b42a3:
      local_81 = (this->builder).generatingOpCodeForSpecConst;
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 0x58))
                         ((long *)CONCAT44(extraout_var_09,iVar4));
      if ((*(byte *)(lVar14 + 0xc) & 1) != 0) {
        (this->builder).generatingOpCodeForSpecConst = true;
      }
      pBVar1 = &this->builder;
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      IVar7 = convertGlslangToSpvType
                        (this,(TType *)CONCAT44(extraout_var_10,iVar4),forwardReferenceOnly);
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x10))
                ((long *)CONCAT44(extraout_var_11,iVar4),this);
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar4) + 0x18))
                                  ((long *)CONCAT44(extraout_var_12,iVar4));
      pTVar11 = (TType *)(**(code **)(*plVar12 + 0xf0))(plVar12);
      rValue = accessChainLoad(this,pTVar11);
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
      (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar4) + 0x10))
                ((long *)CONCAT44(extraout_var_13,iVar4),this);
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_14,iVar4) + 0x18))
                                  ((long *)CONCAT44(extraout_var_14,iVar4));
      pTVar11 = (TType *)(**(code **)(*plVar12 + 0xf0))(plVar12);
      local_80 = accessChainLoad(this,pTVar11);
      iVar4 = (**(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
      iVar4 = *(int *)(CONCAT44(extraout_var_15,iVar4) + 0xc);
      iVar6 = (**(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
      if (*(long *)CONCAT44(extraout_var_16,iVar6) == 0) {
        filename = (char *)0x0;
      }
      else {
        filename = *(char **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 8);
      }
      spv::Builder::setDebugSourceLocation(pBVar1,iVar4,filename);
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
      if (iVar4 != 0) {
        bVar3 = visitSelection::anon_class_16_2_3f94c575::operator()(&isOpSelectable);
        if (bVar3) {
          if ((this->glslangIntermediate->spvVersion).spv < 0x10400) {
            ppIVar15 = (this->builder).module.idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pIVar2 = ppIVar15[rValue];
            if (pIVar2 == (Instruction *)0x0) {
              uVar16 = 0;
            }
            else {
              uVar16 = (ulong)pIVar2->typeId;
            }
            if (ppIVar15[uVar16]->opCode == OpTypeVector) {
              local_7c = spv::Builder::makeBoolType(pBVar1);
              uVar9 = spv::Builder::getNumComponents(pBVar1,rValue);
              IVar10 = spv::Builder::makeVectorType(pBVar1,local_7c,uVar9);
              IVar5 = spv::Builder::smearScalar(pBVar1,DecorationMax,IVar5,IVar10);
            }
          }
          ppIVar15 = (this->builder).module.idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (ppIVar15[rValue] == (Instruction *)0x0) {
            IVar10 = 0;
          }
          else {
            IVar10 = ppIVar15[rValue]->typeId;
          }
          if (IVar10 != IVar7) {
            rValue = spv::Builder::createUnaryOp(pBVar1,OpCopyLogical,IVar7,rValue);
            ppIVar15 = (this->builder).module.idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          }
          if (ppIVar15[local_80] == (Instruction *)0x0) {
            IVar10 = 0;
          }
          else {
            IVar10 = ppIVar15[local_80]->typeId;
          }
          op3 = local_80;
          if (IVar10 != IVar7) {
            op3 = spv::Builder::createUnaryOp(pBVar1,OpCopyLogical,IVar7,local_80);
          }
          IVar5 = spv::Builder::createTriOp(pBVar1,OpSelect,IVar7,IVar5,rValue,op3);
          spv::Builder::clearAccessChain(pBVar1);
          (this->builder).accessChain.isRValue = true;
          (this->builder).accessChain.base = IVar5;
        }
        else {
          iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          DVar8 = TranslatePrecisionDecoration((TType *)CONCAT44(extraout_var_27,iVar4));
          IVar7 = spv::Builder::createVariable(pBVar1,DVar8,Function,IVar7,(char *)0x0,0,true);
          uVar9 = (node_local->dontFlatten & 1) * 2;
          if (node_local->flatten != false) {
            uVar9 = 1;
          }
          spv::Builder::If::If(&local_68,IVar5,uVar9,pBVar1);
          spv::Builder::clearAccessChain(pBVar1);
          spv::Builder::setAccessChainLValue(pBVar1,IVar7);
          iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          multiTypeStore(this,(TType *)CONCAT44(extraout_var_28,iVar4),rValue);
          spv::Builder::If::makeBeginElse(&local_68);
          spv::Builder::clearAccessChain(pBVar1);
          spv::Builder::setAccessChainLValue(pBVar1,IVar7);
          iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          multiTypeStore(this,(TType *)CONCAT44(extraout_var_29,iVar4),local_80);
          spv::Builder::If::makeEndIf(&local_68);
          spv::Builder::clearAccessChain(pBVar1);
          spv::Builder::setAccessChainLValue(pBVar1,IVar7);
        }
      }
      (this->builder).generatingOpCodeForSpecConst = local_81;
      return false;
    }
    bVar3 = visitSelection::anon_class_16_2_3f94c575::operator()(&isOpSelectable);
    if (bVar3) {
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      iVar6 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x18))
                                  ((long *)CONCAT44(extraout_var_04,iVar6));
      pTVar11 = (TType *)(**(code **)(*plVar12 + 0xf0))(plVar12);
      bVar3 = glslang::TType::operator==((TType *)CONCAT44(extraout_var_03,iVar4),pTVar11);
      if (bVar3) {
        iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        iVar6 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
        plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x18))
                                    ((long *)CONCAT44(extraout_var_06,iVar6));
        node_00 = (TIntermTyped *)(**(code **)(*plVar12 + 0xf0))(plVar12);
        bVar3 = glslang::TType::operator==
                          ((TType *)CONCAT44(extraout_var_05,iVar4),(TType *)node_00);
        if (bVar3) {
          iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
          paVar13 = (anon_class_1_0_00000001 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x18))
                              ((long *)CONCAT44(extraout_var_07,iVar4));
          bVar3 = visitSelection::anon_class_16_2_44aef978::operator()::anon_class_1_0_00000001::
                  operator()(paVar13,node_00);
          if (bVar3) {
            iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
            paVar13 = (anon_class_1_0_00000001 *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x18))
                                ((long *)CONCAT44(extraout_var_08,iVar4));
            bVar3 = visitSelection::anon_class_16_2_44aef978::operator()::anon_class_1_0_00000001::
                    operator()(paVar13,node_00);
            if (bVar3) goto LAB_003b42a3;
          }
          goto LAB_003b43b0;
        }
      }
      __assert_fail("node->getType() == node->getTrueBlock() ->getAsTyped()->getType() && node->getType() == node->getFalseBlock()->getAsTyped()->getType()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1137,
                    "auto (anonymous namespace)::TGlslangToSpvTraverser::visitSelection(glslang::TVisit, glslang::TIntermSelection *)::(anonymous class)::operator()() const"
                   );
    }
  }
LAB_003b43b0:
  iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
  if (iVar4 == 0) {
    IVar7 = 0;
  }
  else {
    iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    DVar8 = TranslatePrecisionDecoration((TType *)CONCAT44(extraout_var_17,iVar4));
    iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    IVar7 = convertGlslangToSpvType
                      (this,(TType *)CONCAT44(extraout_var_18,iVar4),forwardReferenceOnly_00);
    IVar7 = spv::Builder::createVariable(&this->builder,DVar8,Function,IVar7,(char *)0x0,0,true);
  }
  uVar9 = 1;
  if (node_local->flatten == false) {
    uVar9 = (node_local->dontFlatten & 1) * 2;
  }
  pBVar1 = &this->builder;
  spv::Builder::If::If(&local_68,IVar5,uVar9,pBVar1);
  iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
  if (CONCAT44(extraout_var_19,iVar4) != 0) {
    iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar4) + 0x10))
              ((long *)CONCAT44(extraout_var_20,iVar4),this);
    if (IVar7 != 0) {
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_21,iVar4) + 0x18))
                                  ((long *)CONCAT44(extraout_var_21,iVar4));
      pTVar11 = (TType *)(**(code **)(*plVar12 + 0xf0))(plVar12);
      IVar5 = accessChainLoad(this,pTVar11);
      spv::Builder::clearAccessChain(pBVar1);
      spv::Builder::setAccessChainLValue(pBVar1,IVar7);
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      multiTypeStore(this,(TType *)CONCAT44(extraout_var_22,iVar4),IVar5);
    }
  }
  iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  if (CONCAT44(extraout_var_23,iVar4) != 0) {
    spv::Builder::If::makeBeginElse(&local_68);
    iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
    (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar4) + 0x10))
              ((long *)CONCAT44(extraout_var_24,iVar4),this);
    if (IVar7 != 0) {
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_25,iVar4) + 0x18))
                                  ((long *)CONCAT44(extraout_var_25,iVar4));
      pTVar11 = (TType *)(**(code **)(*plVar12 + 0xf0))(plVar12);
      IVar5 = accessChainLoad(this,pTVar11);
      spv::Builder::clearAccessChain(pBVar1);
      spv::Builder::setAccessChainLValue(pBVar1,IVar7);
      iVar4 = (*(node_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      multiTypeStore(this,(TType *)CONCAT44(extraout_var_26,iVar4),IVar5);
    }
  }
  spv::Builder::If::makeEndIf(&local_68);
  if (IVar7 != 0) {
    spv::Builder::clearAccessChain(pBVar1);
    spv::Builder::setAccessChainLValue(pBVar1,IVar7);
  }
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitSelection(glslang::TVisit /* visit */, glslang::TIntermSelection* node)
{
    // see if OpSelect can handle it
    const auto isOpSelectable = [&]() {
        if (node->getBasicType() == glslang::EbtVoid)
            return false;
        // OpSelect can do all other types starting with SPV 1.4
        if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_4) {
            // pre-1.4, only scalars and vectors can be handled
            if ((!node->getType().isScalar() && !node->getType().isVector()))
                return false;
        }
        return true;
    };

    // See if it simple and safe, or required, to execute both sides.
    // Crucially, side effects must be either semantically required or avoided,
    // and there are performance trade-offs.
    // Return true if required or a good idea (and safe) to execute both sides,
    // false otherwise.
    const auto bothSidesPolicy = [&]() -> bool {
        // do we have both sides?
        if (node->getTrueBlock()  == nullptr ||
            node->getFalseBlock() == nullptr)
            return false;

        // required? (unless we write additional code to look for side effects
        // and make performance trade-offs if none are present)
        if (!node->getShortCircuit())
            return true;

        // if not required to execute both, decide based on performance/practicality...

        if (!isOpSelectable())
            return false;

        assert(node->getType() == node->getTrueBlock() ->getAsTyped()->getType() &&
               node->getType() == node->getFalseBlock()->getAsTyped()->getType());

        // return true if a single operand to ? : is okay for OpSelect
        const auto operandOkay = [](glslang::TIntermTyped* node) {
            return node->getAsSymbolNode() || node->getType().getQualifier().isConstant();
        };

        return operandOkay(node->getTrueBlock() ->getAsTyped()) &&
               operandOkay(node->getFalseBlock()->getAsTyped());
    };

    spv::Id result = spv::NoResult; // upcoming result selecting between trueValue and falseValue
    // emit the condition before doing anything with selection
    node->getCondition()->traverse(this);
    spv::Id condition = accessChainLoad(node->getCondition()->getType());

    // Find a way of executing both sides and selecting the right result.
    const auto executeBothSides = [&]() -> void {
        // execute both sides
        spv::Id resultType = convertGlslangToSpvType(node->getType());
        node->getTrueBlock()->traverse(this);
        spv::Id trueValue = accessChainLoad(node->getTrueBlock()->getAsTyped()->getType());
        node->getFalseBlock()->traverse(this);
        spv::Id falseValue = accessChainLoad(node->getFalseBlock()->getAsTyped()->getType());

        builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

        // done if void
        if (node->getBasicType() == glslang::EbtVoid)
            return;

        // emit code to select between trueValue and falseValue
        // see if OpSelect can handle the result type, and that the SPIR-V types
        // of the inputs match the result type.
        if (isOpSelectable()) {
            // Emit OpSelect for this selection.

            // smear condition to vector, if necessary (AST is always scalar)
            // Before 1.4, smear like for mix(), starting with 1.4, keep it scalar
            if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_4 && builder.isVector(trueValue)) {
                condition = builder.smearScalar(spv::NoPrecision, condition,
                                                builder.makeVectorType(builder.makeBoolType(),
                                                                       builder.getNumComponents(trueValue)));
            }

            // If the types do not match, it is because of mismatched decorations on aggregates.
            // Since isOpSelectable only lets us get here for SPIR-V >= 1.4, we can use OpCopyObject
            // to get matching types.
            if (builder.getTypeId(trueValue) != resultType) {
                trueValue = builder.createUnaryOp(spv::OpCopyLogical, resultType, trueValue);
            }
            if (builder.getTypeId(falseValue) != resultType) {
                falseValue = builder.createUnaryOp(spv::OpCopyLogical, resultType, falseValue);
            }

            // OpSelect
            result = builder.createTriOp(spv::OpSelect, resultType, condition, trueValue, falseValue);

            builder.clearAccessChain();
            builder.setAccessChainRValue(result);
        } else {
            // We need control flow to select the result.
            // TODO: Once SPIR-V OpSelect allows arbitrary types, eliminate this path.
            result = builder.createVariable(TranslatePrecisionDecoration(node->getType()),
                spv::StorageClassFunction, resultType);

            // Selection control:
            const spv::SelectionControlMask control = TranslateSelectionControl(*node);

            // make an "if" based on the value created by the condition
            spv::Builder::If ifBuilder(condition, control, builder);

            // emit the "then" statement
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
            multiTypeStore(node->getType(), trueValue);

            ifBuilder.makeBeginElse();
            // emit the "else" statement
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
            multiTypeStore(node->getType(), falseValue);

            // finish off the control flow
            ifBuilder.makeEndIf();

            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
        }
    };

    // Execute the one side needed, as per the condition
    const auto executeOneSide = [&]() {
        // Always emit control flow.
        if (node->getBasicType() != glslang::EbtVoid) {
            result = builder.createVariable(TranslatePrecisionDecoration(node->getType()), spv::StorageClassFunction,
                convertGlslangToSpvType(node->getType()));
        }

        // Selection control:
        const spv::SelectionControlMask control = TranslateSelectionControl(*node);

        // make an "if" based on the value created by the condition
        spv::Builder::If ifBuilder(condition, control, builder);

        // emit the "then" statement
        if (node->getTrueBlock() != nullptr) {
            node->getTrueBlock()->traverse(this);
            if (result != spv::NoResult) {
                spv::Id load = accessChainLoad(node->getTrueBlock()->getAsTyped()->getType());

                builder.clearAccessChain();
                builder.setAccessChainLValue(result);
                multiTypeStore(node->getType(), load);
            }
        }

        if (node->getFalseBlock() != nullptr) {
            ifBuilder.makeBeginElse();
            // emit the "else" statement
            node->getFalseBlock()->traverse(this);
            if (result != spv::NoResult) {
                spv::Id load = accessChainLoad(node->getFalseBlock()->getAsTyped()->getType());

                builder.clearAccessChain();
                builder.setAccessChainLValue(result);
                multiTypeStore(node->getType(), load);
            }
        }

        // finish off the control flow
        ifBuilder.makeEndIf();

        if (result != spv::NoResult) {
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
        }
    };

    // Try for OpSelect (or a requirement to execute both sides)
    if (bothSidesPolicy()) {
        SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
        if (node->getType().getQualifier().isSpecConstant())
            spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
        executeBothSides();
    } else
        executeOneSide();

    return false;
}